

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ctr_drbg.c
# Opt level: O1

int ctr_drbg_update_internal(mbedtls_ctr_drbg_context *ctx,uchar *data)

{
  uchar *puVar1;
  int iVar2;
  long lVar3;
  byte *output;
  uint uVar4;
  bool bVar5;
  uchar tmp [48];
  byte local_58 [32];
  undefined8 local_38;
  undefined8 uStack_30;
  
  output = local_58;
  local_38 = 0;
  uStack_30 = 0;
  local_58[0x10] = 0;
  local_58[0x11] = 0;
  local_58[0x12] = 0;
  local_58[0x13] = 0;
  local_58[0x14] = 0;
  local_58[0x15] = 0;
  local_58[0x16] = 0;
  local_58[0x17] = 0;
  local_58[0x18] = 0;
  local_58[0x19] = 0;
  local_58[0x1a] = 0;
  local_58[0x1b] = 0;
  local_58[0x1c] = 0;
  local_58[0x1d] = 0;
  local_58[0x1e] = 0;
  local_58[0x1f] = 0;
  local_58[0] = 0;
  local_58[1] = 0;
  local_58[2] = 0;
  local_58[3] = 0;
  local_58[4] = 0;
  local_58[5] = 0;
  local_58[6] = 0;
  local_58[7] = 0;
  local_58[8] = 0;
  local_58[9] = 0;
  local_58[10] = 0;
  local_58[0xb] = 0;
  local_58[0xc] = 0;
  local_58[0xd] = 0;
  local_58[0xe] = 0;
  local_58[0xf] = 0;
  uVar4 = 0;
  do {
    lVar3 = 0xf;
    do {
      if (lVar3 == -1) break;
      puVar1 = ctx->counter + lVar3;
      *puVar1 = *puVar1 + '\x01';
      lVar3 = lVar3 + -1;
    } while (*puVar1 == '\0');
    iVar2 = mbedtls_aes_crypt_ecb(&ctx->aes_ctx,1,ctx->counter,output);
    if (iVar2 != 0) {
      return iVar2;
    }
    output = output + 0x10;
    bVar5 = 0x1f < uVar4;
    uVar4 = uVar4 + 0x10;
    if (bVar5) {
      lVar3 = 0;
      do {
        local_58[lVar3] = local_58[lVar3] ^ data[lVar3];
        lVar3 = lVar3 + 1;
      } while (lVar3 != 0x30);
      iVar2 = mbedtls_aes_setkey_enc(&ctx->aes_ctx,local_58,0x100);
      if (iVar2 == 0) {
        *(undefined8 *)ctx->counter = local_38;
        *(undefined8 *)(ctx->counter + 8) = uStack_30;
        iVar2 = 0;
      }
      return iVar2;
    }
  } while( true );
}

Assistant:

static int ctr_drbg_update_internal( mbedtls_ctr_drbg_context *ctx,
                              const unsigned char data[MBEDTLS_CTR_DRBG_SEEDLEN] )
{
    unsigned char tmp[MBEDTLS_CTR_DRBG_SEEDLEN];
    unsigned char *p = tmp;
    int i, j;
    int ret = 0;

    memset( tmp, 0, MBEDTLS_CTR_DRBG_SEEDLEN );

    for( j = 0; j < MBEDTLS_CTR_DRBG_SEEDLEN; j += MBEDTLS_CTR_DRBG_BLOCKSIZE )
    {
        /*
         * Increase counter
         */
        for( i = MBEDTLS_CTR_DRBG_BLOCKSIZE; i > 0; i-- )
            if( ++ctx->counter[i - 1] != 0 )
                break;

        /*
         * Crypt counter block
         */
        if( ( ret = mbedtls_aes_crypt_ecb( &ctx->aes_ctx, MBEDTLS_AES_ENCRYPT, ctx->counter, p ) ) != 0 )
        {
            return( ret );
        }

        p += MBEDTLS_CTR_DRBG_BLOCKSIZE;
    }

    for( i = 0; i < MBEDTLS_CTR_DRBG_SEEDLEN; i++ )
        tmp[i] ^= data[i];

    /*
     * Update key and counter
     */
    if( ( ret = mbedtls_aes_setkey_enc( &ctx->aes_ctx, tmp, MBEDTLS_CTR_DRBG_KEYBITS ) ) != 0 )
    {
        return( ret );
    }
    memcpy( ctx->counter, tmp + MBEDTLS_CTR_DRBG_KEYSIZE, MBEDTLS_CTR_DRBG_BLOCKSIZE );

    return( 0 );
}